

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLiSample * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (LightLiSample *__return_storage_ptr__,PortalImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Interval<float> IVar4;
  Point3fi *pPVar5;
  uintptr_t iptr;
  undefined8 uVar12;
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined8 uVar14;
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [64];
  Point3f PVar16;
  Vector3f VVar17;
  Bounds2f BVar18;
  SampledSpectrum SVar19;
  Float mapPDF;
  Point2f uv;
  Float duv_dw;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Point2f u_local;
  Tuple3<pbrt::Point3,_float> local_98;
  Bounds2f b;
  Interaction local_78;
  undefined1 extraout_var [56];
  undefined1 auVar15 [56];
  
  auVar15 = in_ZMM1._8_56_;
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  u_local.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7._0_16_);
  PVar16 = LightSampleContext::p(&ctx);
  local_78.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
       PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = in_register_00001208;
  local_78.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = (Interval<float>)vmovlps_avx(auVar8._0_16_)
  ;
  BVar18 = ImageBounds(this,(Point3f *)&local_78);
  auVar13._0_8_ = BVar18.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar13._8_56_ = auVar15;
  auVar9._0_8_ = BVar18.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar9._8_56_ = in_register_00001208;
  b = (Bounds2f)vmovlhps_avx(auVar9._0_16_,auVar13._0_16_);
  auVar10._0_8_ = WindowedPiecewiseConstant2D::Sample(&this->distribution,&u_local,&b,&mapPDF);
  auVar10._8_56_ = extraout_var;
  uVar14 = 0;
  uv.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar10._0_16_);
  if ((mapPDF != 0.0) || (NAN(mapPDF))) {
    auVar15 = extraout_var;
    VVar17 = RenderFromImage(this,&uv,&duv_dw);
    auVar11._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar15;
    if ((duv_dw != 0.0) || (NAN(duv_dw))) {
      _local_d8 = auVar11._0_16_;
      uVar12 = 0;
      if (ABS(mapPDF / duv_dw) != INFINITY) {
        SVar19 = ImageLookup(this,&uv,&lambda);
        local_c8 = SVar19.values.values._8_8_;
        local_b8 = SVar19.values.values._0_8_;
        uStack_c0 = uVar14;
        uStack_b0 = uVar12;
        PVar16 = LightSampleContext::p(&ctx);
        fVar1 = this->sceneRadius + this->sceneRadius;
        local_98.z = PVar16.super_Tuple3<pbrt::Point3,_float>.z +
                     fVar1 * VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar6._0_4_ = PVar16.super_Tuple3<pbrt::Point3,_float>.x + fVar1 * (float)local_d8._0_4_;
        auVar6._4_4_ = PVar16.super_Tuple3<pbrt::Point3,_float>.y + fVar1 * (float)local_d8._4_4_;
        auVar6._8_4_ = (float)uVar12 + fVar1 * fStack_d0;
        auVar6._12_4_ = (float)((ulong)uVar12 >> 0x20) + fVar1 * fStack_cc;
        local_98._0_8_ = vmovlps_avx(auVar6);
        Interaction::Interaction
                  (&local_78,(Point3f *)&local_98,0.0,&(this->super_LightBase).mediumInterface);
        auVar3._8_8_ = uStack_b0;
        auVar3._0_8_ = local_b8;
        auVar2._8_8_ = uStack_c0;
        auVar2._0_8_ = local_c8;
        auVar2 = vunpcklpd_avx(auVar3,auVar2);
        *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar2;
        uVar14 = vmovlps_avx(_local_d8);
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar14 >> 0x20);
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
             VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        IVar4.high = local_78.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
        IVar4.low = local_78.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
        __return_storage_ptr__->pdf = mapPDF / duv_dw;
        (__return_storage_ptr__->light).
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits = (ulong)this | 0x9000000000000;
        (__return_storage_ptr__->pLight).mediumInterface = local_78.mediumInterface;
        (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
             local_78.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
        (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IVar4;
        (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             local_78.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
        (__return_storage_ptr__->pLight).time = local_78.time;
        (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.x =
             local_78.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y =
             local_78.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z =
             local_78.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.x =
             local_78.n.super_Tuple3<pbrt::Normal3,_float>.x;
        (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y =
             local_78.n.super_Tuple3<pbrt::Normal3,_float>.y;
        *(undefined8 *)&(__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z =
             local_78._48_8_;
        *(undefined8 *)&(__return_storage_ptr__->pLight).uv.super_Tuple2<pbrt::Point2,_float>.y =
             local_78._56_8_;
        (__return_storage_ptr__->pLight).medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (uintptr_t)
                local_78.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        return __return_storage_ptr__;
      }
      LogFatal<char_const(&)[12]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x443,"Check failed: %s",(char (*) [12])"!IsInf(pdf)");
    }
  }
  pPVar5 = &(__return_storage_ptr__->pLight).pi;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.low = 0.0;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.high = 0.0;
  (__return_storage_ptr__->pLight).time = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).uv.super_Tuple2<pbrt::Point2,_float>.y = 0;
  (__return_storage_ptr__->pLight).mediumInterface = (MediumInterface *)0x0;
  (__return_storage_ptr__->pLight).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->L).values.values[0] = 0.0;
  (__return_storage_ptr__->L).values.values[1] = 0.0;
  (__return_storage_ptr__->L).values.values[2] = 0.0;
  (__return_storage_ptr__->L).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->light).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  pPVar5 = &(__return_storage_ptr__->pLight).pi;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.low = 0.0;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = 0.0;
  pPVar5 = &(__return_storage_ptr__->pLight).pi;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = 0.0;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.high = 0.0;
  pPVar5 = &(__return_storage_ptr__->pLight).pi;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.low = 0.0;
  (pPVar5->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.high = 0.0;
  return __return_storage_ptr__;
}

Assistant:

LightLiSample PortalImageInfiniteLight::SampleLi(LightSampleContext ctx, Point2f u,
                                                 SampledWavelengths lambda,
                                                 LightSamplingMode mode) const {
    Bounds2f b = ImageBounds(ctx.p());

    // Find $(u,v)$ sample coordinates in infinite light texture
    Float mapPDF;
    Point2f uv = distribution.Sample(u, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f wi = RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLiSample(
        this, L, wi, pdf,
        Interaction(ctx.p() + wi * (2 * sceneRadius), 0 /* time */, &mediumInterface));
}